

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperSTRCASENE
          (internal *this,char *s1_expression,char *s2_expression,char *s1,char *s2)

{
  int iVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  bool bVar3;
  AssertionResult AVar4;
  AssertionResult local_48;
  char *local_38;
  char *s1_expression_local;
  char *s2_expression_local;
  char *s1_local;
  char *s2_local;
  
  bVar3 = s2 == (char *)0x0;
  local_38 = s1_expression;
  s1_expression_local = s2_expression;
  s2_expression_local = s1;
  s1_local = s2;
  if (s1 == (char *)0x0) {
LAB_001244bc:
    if (bVar3) {
      local_48.success_ = false;
      local_48.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_48,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_38);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&s1_expression_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") (ignoring case), actual: \"");
      pAVar2 = AssertionResult::operator<<(pAVar2,&s2_expression_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])"\" vs \"");
      pAVar2 = AssertionResult::operator<<(pAVar2,&s1_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x1425cd);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_48.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      s2_expression = (char *)extraout_RDX_00;
      goto LAB_00124572;
    }
  }
  else if (s2 != (char *)0x0) {
    iVar1 = strcasecmp(s1,s2);
    bVar3 = iVar1 == 0;
    s2_expression = (char *)extraout_RDX;
    goto LAB_001244bc;
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_00124572:
  AVar4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)s2_expression;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRCASENE(const char* s1_expression,
                                   const char* s2_expression,
                                   const char* s1,
                                   const char* s2) {
  if (!String::CaseInsensitiveCStringEquals(s1, s2)) {
    return AssertionSuccess();
  } else {
    return AssertionFailure()
        << "Expected: (" << s1_expression << ") != ("
        << s2_expression << ") (ignoring case), actual: \""
        << s1 << "\" vs \"" << s2 << "\"";
  }
}